

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  BYTE *iEnd;
  BYTE *iStart;
  uint uVar1;
  U32 hBits;
  uint uVar2;
  uint uVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  uint uVar7;
  int *piVar8;
  size_t sVar9;
  BYTE *pBVar10;
  size_t sVar11;
  uint uVar12;
  BYTE *pBVar13;
  long lVar14;
  int *piVar15;
  U32 UVar16;
  int *piVar17;
  BYTE *pBVar18;
  ulong uVar19;
  int *literals;
  U32 local_b8;
  U32 local_b4;
  int local_a0;
  
  pUVar4 = ms->hashTable;
  uVar1 = (ms->cParams).targetLength;
  hBits = (ms->cParams).hashLog;
  pBVar5 = (ms->window).base;
  pBVar6 = (ms->window).dictBase;
  uVar2 = (ms->window).lowLimit;
  uVar3 = (ms->window).dictLimit;
  pBVar18 = pBVar6 + uVar3;
  iEnd = (BYTE *)((long)src + srcSize);
  piVar8 = (int *)((long)src + (srcSize - 8));
  iStart = pBVar5 + uVar3;
  local_b4 = *rep;
  local_b8 = rep[1];
  literals = (int *)src;
LAB_003a1877:
  do {
    if (piVar8 <= src) {
      *rep = local_b4;
      rep[1] = local_b8;
      return (long)iEnd - (long)literals;
    }
    sVar9 = ZSTD_hashPtr(src,hBits,mls);
    uVar7 = pUVar4[sVar9];
    pBVar13 = pBVar6;
    if (uVar3 <= uVar7) {
      pBVar13 = pBVar5;
    }
    uVar19 = (long)src - (long)pBVar5;
    UVar16 = (U32)uVar19;
    uVar12 = (UVar16 - local_b4) + 1;
    pUVar4[sVar9] = UVar16;
    if (uVar2 < uVar12 && 2 < (uVar3 - 1) - uVar12) {
      pBVar10 = pBVar6;
      if (uVar3 <= uVar12) {
        pBVar10 = pBVar5;
      }
      if (*(int *)(pBVar10 + uVar12) != *(int *)((long)src + 1)) goto LAB_003a18f6;
      piVar17 = (int *)((long)src + 1);
      pBVar13 = iEnd;
      if (uVar12 < uVar3) {
        pBVar13 = pBVar18;
      }
      sVar9 = ZSTD_count_2segments
                        ((BYTE *)((long)src + 5),pBVar10 + (ulong)uVar12 + 4,iEnd,pBVar13,iStart);
      ZSTD_storeSeq(seqStore,(long)piVar17 - (long)literals,literals,0,sVar9 + 1);
    }
    else {
LAB_003a18f6:
      if ((uVar7 < uVar2) || (piVar15 = (int *)(pBVar13 + uVar7), *piVar15 != *src)) {
        src = (void *)((long)src + ((long)src - (long)literals >> 8) + (ulong)(uVar1 + (uVar1 == 0))
                      );
        goto LAB_003a1877;
      }
      pBVar10 = iStart;
      pBVar13 = iEnd;
      if (uVar7 < uVar3) {
        pBVar10 = pBVar6 + uVar2;
        pBVar13 = pBVar18;
      }
      sVar9 = ZSTD_count_2segments
                        ((BYTE *)((long)src + 4),(BYTE *)(piVar15 + 1),iEnd,pBVar13,iStart);
      for (lVar14 = 0;
          ((piVar17 = (int *)(lVar14 + (long)src), pBVar10 < (BYTE *)((long)piVar15 + lVar14) &&
           (literals < piVar17)) &&
          (*(char *)((long)src + lVar14 + -1) == *(char *)((long)piVar15 + lVar14 + -1)));
          lVar14 = lVar14 + -1) {
      }
      sVar9 = sVar9 - lVar14;
      ZSTD_storeSeq(seqStore,(long)piVar17 - (long)literals,literals,(UVar16 - uVar7) + 2,sVar9 + 1)
      ;
      local_b8 = local_b4;
      local_b4 = UVar16 - uVar7;
    }
    src = (void *)(sVar9 + 4 + (long)piVar17);
    literals = (int *)src;
    if (src <= piVar8) {
      sVar9 = ZSTD_hashPtr(pBVar5 + (uVar19 & 0xffffffff) + 2,hBits,mls);
      pUVar4[sVar9] = UVar16 + 2;
      local_a0 = (int)pBVar5;
      sVar9 = ZSTD_hashPtr((void *)((long)src + -2),hBits,mls);
      pUVar4[sVar9] = (int)(void *)((long)src + -2) - local_a0;
      UVar16 = local_b8;
      for (; local_b8 = UVar16, literals = (int *)src, src <= piVar8;
          src = (void *)((long)src + sVar9 + 4)) {
        UVar16 = (int)src - local_a0;
        uVar7 = UVar16 - local_b8;
        pBVar13 = pBVar5;
        if (uVar7 < uVar3) {
          pBVar13 = pBVar6;
        }
        if (((uVar7 <= uVar2) || ((uVar3 - 1) - uVar7 < 3)) || (*(int *)(pBVar13 + uVar7) != *src))
        break;
        pBVar10 = iEnd;
        if (uVar7 < uVar3) {
          pBVar10 = pBVar18;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar13 + uVar7) + 4),iEnd,
                           pBVar10,iStart);
        ZSTD_storeSeq(seqStore,0,src,0,sVar9 + 1);
        sVar11 = ZSTD_hashPtr(src,hBits,mls);
        pUVar4[sVar11] = UVar16;
        UVar16 = local_b4;
        local_b4 = local_b8;
      }
    }
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   dictStartIndex = ms->window.lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   prefixStartIndex = ms->window.dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    current = (U32)(ip-base);
        const U32    repIndex = current + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashTable[h] = current;   /* update hash table */
        assert(offset_1 <= current +1);   /* check repIndex */

        if ( (((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */ & (repIndex > dictStartIndex))
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, ip-anchor, anchor, 0, mLength-MINMATCH);
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset = current - matchIndex;
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
        }   }

        /* found a match : store it */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+current+2, hlog, mls)] = current+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (repIndex2 > dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, 0, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return iend - anchor;
}